

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::hex_test::hex_test(hex_test *this)

{
  hex_test *this_local;
  
  compile_fixture::compile_fixture(&this->super_compile_fixture);
  (this->super_compile_fixture)._vptr_compile_fixture = (_func_int **)&PTR__hex_test_0032e510;
  return;
}

Assistant:

void test()
      {
      TEST_EQ("255", run("#xff"));
      TEST_EQ("255", run("#xFF"));
      TEST_EQ("255", run("#xFf"));
      TEST_EQ("255", run("#xfF"));
      TEST_EQ("243", run("#xf3"));
      TEST_EQ("11229389", run("#xab58cd"));
      TEST_EQ("error: Unsupported number syntax", run("#xg"));
      }